

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O3

bool __thiscall argh::parser::is_option(parser *this,string *arg)

{
  byte bVar1;
  bool bVar2;
  istringstream istr;
  long local_198 [4];
  byte abStack_178 [88];
  ios_base local_120 [264];
  
  if (arg->_M_string_length != 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)local_198,(string *)arg,_S_in);
    std::istream::_M_extract<double>((double *)local_198);
    bVar1 = abStack_178[*(long *)(local_198[0] + -0x18)];
    std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
    std::ios_base::~ios_base(local_120);
    if ((bVar1 & 5) == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = *(arg->_M_dataplus)._M_p == '-';
    }
    return bVar2;
  }
  __assert_fail("0 != arg.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fzyukio[P]cspade-full/argh.h"
                ,0x11a,"bool argh::parser::is_option(const std::string &) const");
}

Assistant:

inline bool parser::is_option(std::string const &arg) const {
        assert(0 != arg.size());
        if (is_number(arg))
            return false;
        return '-' == arg[0];
    }